

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsFieldDescriptorSetFixedOrder
              (FmsFieldDescriptor fd,FmsFieldType field_type,FmsBasisType basis_type,FmsInt order)

{
  ulong uVar1;
  long lVar2;
  undefined4 *puVar3;
  long in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  _FmsFieldDescriptor_FixedOrder *fo;
  FmsInt et_1;
  FmsInt i;
  FmsInt pp2_1;
  FmsInt pp1_1;
  FmsInt et;
  FmsInt pp3;
  FmsInt pp2;
  FmsInt pp1;
  FmsInt pm3;
  FmsInt pm2;
  FmsInt pm1;
  FmsInt p;
  FmsInt dim;
  FmsInt ent_dofs [8];
  FmsInt num_dofs;
  FmsComponent comp;
  ulong local_e0;
  ulong local_d8;
  ulong local_c0;
  long local_78 [9];
  long local_30;
  long local_28;
  long local_20;
  undefined4 local_18;
  undefined4 local_14;
  long local_10;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = 1;
  }
  else {
    local_28 = *(long *)(in_RDI + 8);
    if (local_28 == 0) {
      local_4 = 2;
    }
    else if (*(long *)(in_RDI + 0x18) == 0) {
      local_30 = 0;
      uVar1 = *(ulong *)(local_28 + 0x10);
      local_20 = in_RCX;
      local_18 = in_EDX;
      local_14 = in_ESI;
      local_10 = in_RDI;
      switch(in_ESI) {
      case 0:
        local_78[1] = in_RCX + -1;
        if (in_RCX == 0) {
          return 4;
        }
        local_78[0] = 1;
        local_78[2] = (ulong)(local_78[1] * (in_RCX + -2)) >> 1;
        local_78[3] = local_78[1] * local_78[1];
        local_78[4] = (ulong)(local_78[2] * (in_RCX + -3)) / 3;
        local_78[5] = local_78[1] * local_78[1] * local_78[1];
        local_78[6] = local_78[2] * local_78[1];
        local_78[7] = (ulong)(local_78[2] * (in_RCX + in_RCX + -3)) / 3;
        break;
      case 1:
      case 2:
        local_78[1] = in_RCX + 1;
        local_78[0] = 1;
        local_78[2] = (ulong)(local_78[1] * (in_RCX + 2)) >> 1;
        local_78[3] = local_78[1] * local_78[1];
        local_78[4] = (ulong)(local_78[2] * (in_RCX + 3)) / 3;
        local_78[5] = local_78[1] * local_78[1] * local_78[1];
        local_78[6] = local_78[2] * local_78[1];
        local_78[7] = (ulong)(local_78[2] * (in_RCX + in_RCX + 3)) / 3;
        for (local_c0 = 0; local_c0 < 8; local_c0 = local_c0 + 1) {
          if (FmsEntityDim[local_c0] < uVar1) {
            local_78[local_c0] = 0;
          }
        }
        break;
      case 3:
        FmsAbortNotImplemented();
        break;
      case 4:
        lVar2 = in_RCX + 1;
        local_78[0] = 0;
        local_78[1] = 0;
        local_78[4] = 0;
        local_78[5] = 0;
        if (uVar1 == 2) {
          local_78[1] = lVar2;
          local_78[2] = in_RCX * lVar2;
          local_78[3] = in_RCX * 2 * lVar2;
        }
        else {
          local_78[2] = (ulong)(lVar2 * (in_RCX + 2)) >> 1;
          local_78[3] = lVar2 * lVar2;
          local_78[4] = (ulong)(in_RCX * lVar2 * (in_RCX + 2)) >> 1;
          local_78[5] = in_RCX * 3 * lVar2 * lVar2;
        }
        local_78[6] = 0;
        local_78[7] = 0;
        break;
      default:
        return 5;
      }
      for (local_d8 = 0; local_d8 < *(ulong *)(local_28 + 0x20); local_d8 = local_d8 + 1) {
        for (local_e0 = 0; local_e0 < 8; local_e0 = local_e0 + 1) {
          local_30 = *(long *)(*(long *)(local_28 + 0x30) + local_d8 * 0xe8 + 8 + local_e0 * 8) *
                     local_78[local_e0] + local_30;
        }
      }
      puVar3 = (undefined4 *)malloc(0x10);
      if (puVar3 == (undefined4 *)0x0) {
        local_4 = 6;
      }
      else {
        *puVar3 = local_14;
        puVar3[1] = local_18;
        *(long *)(puVar3 + 2) = local_20;
        *(undefined4 *)(local_10 + 0x10) = 0;
        *(undefined4 **)(local_10 + 0x18) = puVar3;
        *(long *)(local_10 + 0x20) = local_30;
        local_4 = 0;
      }
    }
    else {
      local_4 = 3;
    }
  }
  return local_4;
}

Assistant:

int FmsFieldDescriptorSetFixedOrder(FmsFieldDescriptor fd,
                                    FmsFieldType field_type,
                                    FmsBasisType basis_type, FmsInt order) {
  if (!fd) { E_RETURN(1); }
  FmsComponent comp = fd->component;
  if (!comp) { E_RETURN(2); }
  if (fd->descriptor.any != NULL) { E_RETURN(3); }
  FmsInt num_dofs = 0;
  // Count the number of dofs - based on component, field_type and order
  FmsInt ent_dofs[FMS_NUM_ENTITY_TYPES];
  const FmsInt dim = comp->dim;
  const FmsInt p = order;
  switch (field_type) {
  case FMS_CONTINUOUS: {
    const FmsInt pm1 = p-1, pm2 = p-2, pm3 = p-3;
    if (p <= 0) { E_RETURN(4); }
    ent_dofs[FMS_VERTEX] = 1;
    ent_dofs[FMS_EDGE] = pm1;
    ent_dofs[FMS_TRIANGLE] = (pm1*pm2)/2;
    ent_dofs[FMS_QUADRILATERAL] = pm1*pm1;
    ent_dofs[FMS_TETRAHEDRON] = (ent_dofs[FMS_TRIANGLE]*pm3)/3;
    ent_dofs[FMS_HEXAHEDRON] = ent_dofs[FMS_QUADRILATERAL]*pm1;
    ent_dofs[FMS_WEDGE] = ent_dofs[FMS_TRIANGLE]*pm1;
    ent_dofs[FMS_PYRAMID] = (ent_dofs[FMS_TRIANGLE]*(p+pm3))/3;
    break;
  }
  case FMS_DISCONTINUOUS:
  case FMS_DISCONTINUOUS_WEIGHTED: {
    const FmsInt pp1 = p+1, pp2 = p+2, pp3 = p+3;
    // if (p < 0) { E_RETURN(4); } // If we make FmsInt a signed type
    ent_dofs[FMS_VERTEX] = 1;
    ent_dofs[FMS_EDGE] = pp1;
    ent_dofs[FMS_TRIANGLE] = (pp1*pp2)/2;
    ent_dofs[FMS_QUADRILATERAL] = pp1*pp1;
    ent_dofs[FMS_TETRAHEDRON] = (ent_dofs[FMS_TRIANGLE]*pp3)/3;
    ent_dofs[FMS_HEXAHEDRON] = ent_dofs[FMS_QUADRILATERAL]*pp1;
    ent_dofs[FMS_WEDGE] = ent_dofs[FMS_TRIANGLE]*pp1;
    ent_dofs[FMS_PYRAMID] = (ent_dofs[FMS_TRIANGLE]*(p+pp3))/3;
    for (FmsInt et = 0; et < FMS_NUM_ENTITY_TYPES; et++) {
      if (FmsEntityDim[et] < dim) {
        ent_dofs[et] = 0;
      }
    }
    break;
  }
  case FMS_HCURL: {
    FmsAbortNotImplemented();
    break;
  }
  case FMS_HDIV: {
    const FmsInt pp1 = p + 1, pp2 = p + 2;
    ent_dofs[FMS_VERTEX] = 0;
    ent_dofs[FMS_EDGE] = 0;
    ent_dofs[FMS_TETRAHEDRON] = 0;
    ent_dofs[FMS_HEXAHEDRON] = 0;
    if(dim == 2) {
      ent_dofs[FMS_EDGE] = pp1;
      ent_dofs[FMS_TRIANGLE] = p*pp1;
      ent_dofs[FMS_QUADRILATERAL] = 2*p*pp1;
    } else {
      ent_dofs[FMS_TRIANGLE] = pp1*pp2/2;
      ent_dofs[FMS_QUADRILATERAL] = pp1*pp1;
      ent_dofs[FMS_TETRAHEDRON] = p*pp1*(p + 2)/2;
      ent_dofs[FMS_HEXAHEDRON] = 3*p*pp1*pp1;
    }
    ent_dofs[FMS_WEDGE] = 0;
    ent_dofs[FMS_PYRAMID] = 0;
    break;
  }
  default: E_RETURN(5);
  }
  // Count the dofs part by part
  for (FmsInt i = 0; i < comp->num_parts; i++) {
    for (FmsInt et = 0; et < FMS_NUM_ENTITY_TYPES; et++) {
      num_dofs += comp->parts[i].num_entities[et] * ent_dofs[et];
    }
  }

  // Construct fixed-order descriptor
  struct _FmsFieldDescriptor_FixedOrder *fo;
  fo = malloc(sizeof(*fo));
  if (fo == NULL) { E_RETURN(6); }
  fo->field_type = field_type;
  fo->basis_type = basis_type;
  fo->order = order;
  // Update fd
  fd->descr_type = FMS_FIXED_ORDER;
  fd->descriptor.fixed_order = fo;
  fd->num_dofs = num_dofs;
  return 0;
}